

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_py_generator.cc
# Opt level: O0

string * __thiscall
t_py_generator::render_field_default_value_abi_cxx11_
          (string *__return_storage_ptr__,t_py_generator *this,t_field *tfield)

{
  t_type *ptVar1;
  t_const_value *ptVar2;
  allocator local_29;
  t_type *local_28;
  t_type *type;
  t_field *tfield_local;
  t_py_generator *this_local;
  
  type = (t_type *)tfield;
  tfield_local = (t_field *)this;
  this_local = (t_py_generator *)__return_storage_ptr__;
  ptVar1 = t_field::get_type(tfield);
  local_28 = t_generator::get_true_type(ptVar1);
  ptVar2 = t_field::get_value((t_field *)type);
  ptVar1 = local_28;
  if (ptVar2 == (t_const_value *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"None",&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  else {
    ptVar2 = t_field::get_value((t_field *)type);
    render_const_value_abi_cxx11_(__return_storage_ptr__,this,ptVar1,ptVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_py_generator::render_field_default_value(t_field* tfield) {
  t_type* type = get_true_type(tfield->get_type());
  if (tfield->get_value() != nullptr) {
    return render_const_value(type, tfield->get_value());
  } else {
    return "None";
  }
}